

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O1

int eval_expr(Expr *tree,lword *result)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  lword lval;
  lword rval;
  ulong local_30;
  byte local_28;
  undefined7 uStack_27;
  
  if (tree == (Expr *)0x0) {
    uVar3 = 0;
    ierror("%sNULL tree","eval_expr: ");
    iVar1 = 1;
    goto LAB_00114cee;
  }
  if (tree->left == (Expr *)0x0) {
    iVar1 = 1;
    bVar4 = false;
  }
  else {
    iVar1 = eval_expr(tree->left,(lword *)&local_30);
    bVar4 = iVar1 != 0;
  }
  if (tree->right == (Expr *)0x0) {
    bVar5 = false;
  }
  else {
    iVar2 = eval_expr(tree->right,(lword *)&local_28);
    bVar5 = iVar2 != 0;
    if (!bVar5) {
      iVar1 = 0;
    }
  }
  switch(tree->type) {
  case 0:
    uVar3 = CONCAT71(uStack_27,local_28) + local_30;
    break;
  case 1:
    uVar3 = local_30 - CONCAT71(uStack_27,local_28);
    iVar2 = 1;
    if (bVar5) {
      iVar2 = iVar1;
    }
    if (!bVar4) {
      iVar1 = iVar2;
    }
    break;
  case 2:
    uVar3 = CONCAT71(uStack_27,local_28) * local_30;
    break;
  case 3:
    if (CONCAT71(uStack_27,local_28) != 0) {
      uVar3 = (long)local_30 / CONCAT71(uStack_27,local_28);
      break;
    }
    goto LAB_00114f09;
  case 4:
    if (CONCAT71(uStack_27,local_28) != 0) {
      uVar3 = (long)local_30 % CONCAT71(uStack_27,local_28);
      break;
    }
LAB_00114f09:
    uVar3 = 0;
    error(0x67,scriptname,(ulong)(uint)line);
    break;
  case 5:
    uVar3 = -local_30;
    break;
  case 6:
    uVar3 = ~local_30;
    break;
  case 7:
    uVar3 = (ulong)(CONCAT71(uStack_27,local_28) != 0 && local_30 != 0);
    break;
  case 8:
    bVar4 = CONCAT71(uStack_27,local_28) == 0 && local_30 == 0;
    goto LAB_00114ee3;
  case 9:
    uVar3 = CONCAT71(uStack_27,local_28) & local_30;
    break;
  case 10:
    uVar3 = CONCAT71(uStack_27,local_28) | local_30;
    break;
  case 0xb:
    uVar3 = CONCAT71(uStack_27,local_28) ^ local_30;
    break;
  case 0xc:
    bVar4 = local_30 == 0;
    goto LAB_00114e63;
  case 0xd:
    uVar3 = local_30 << (local_28 & 0x3f);
    break;
  case 0xe:
    uVar3 = (long)local_30 >> (local_28 & 0x3f);
    break;
  case 0xf:
    uVar3 = (ulong)((long)local_30 < CONCAT71(uStack_27,local_28));
    break;
  case 0x10:
    uVar3 = (ulong)(CONCAT71(uStack_27,local_28) < (long)local_30);
    break;
  case 0x11:
    uVar3 = (ulong)((long)local_30 <= CONCAT71(uStack_27,local_28));
    break;
  case 0x12:
    uVar3 = (ulong)(CONCAT71(uStack_27,local_28) <= (long)local_30);
    break;
  case 0x13:
    bVar4 = local_30 == CONCAT71(uStack_27,local_28);
LAB_00114ee3:
    uVar3 = (ulong)!bVar4;
    break;
  case 0x14:
    bVar4 = local_30 == CONCAT71(uStack_27,local_28);
LAB_00114e63:
    uVar3 = (ulong)bVar4;
    break;
  case 0x15:
    goto switchD_00114d40_caseD_15;
  case 0x16:
    iVar1 = 0;
    goto switchD_00114d40_caseD_15;
  default:
    uVar3 = 0;
    ierror("%sIllegal tree type %d","eval_expr: ");
  }
LAB_00114cee:
  *result = uVar3;
  return iVar1;
switchD_00114d40_caseD_15:
  uVar3 = tree->val;
  goto LAB_00114cee;
}

Assistant:

static int eval_expr(struct Expr *tree,lword *result)
/* evaluate expression tree, returns !0 when result is absolute */
{
  const char *fn = "eval_expr: ";
  int abs = 1;
  int labs=0,rabs=0;
  lword val=0,lval,rval;

  if (tree) {
    if (tree->left) {
      if (!(labs = eval_expr(tree->left,&lval)))
        abs = 0;
    }
    if (tree->right) {
      if (!(rabs = eval_expr(tree->right,&rval)))
        abs = 0;
    }

    switch(tree->type) {
      case ADD:
        val = lval + rval;
        break;
      case SUB:
        val = lval - rval;
        if (!labs && !rabs)
          abs = 1;  /* result is absolute, when both are reloc */
        break;
      case MUL:
        val = lval * rval;
        break;
      case DIV:
        if (rval == 0) {
          error(103,scriptname,line);  /* Division by zero */
          val = 0;
        }
        else
          val = lval / rval;
        break;
      case MOD:
        if (rval == 0) {
          error(103,scriptname,line);  /* Division by zero */
          val = 0;
        }
        else
          val = lval % rval;
        break;
      case NEG:
        val = -lval;
        break;
      case CPL:
        val = ~lval;
        break;
      case LAND:
        val = lval && rval;
        break;
      case LOR:
        val = lval || rval;
        break;
      case BAND:
        val = lval & rval;
        break;
      case BOR:
        val = lval | rval;
        break;
      case XOR:
        val = lval ^ rval;
        break;
      case NOT:
        val = !lval;
        break;
      case LSH:
        val = lval << rval;
        break;
      case RSH:
        val = lval >> rval;
        break;
      case LT:
        val = lval < rval;
        break;
      case GT:
        val = lval > rval;
        break;
      case LEQ:
        val = lval <= rval;
        break;
      case GEQ:
        val = lval >= rval;
        break;
      case NEQ:
        val = lval != rval;
        break;
      case EQ:
        val = lval == rval;
        break;
      case REL:
        abs = 0;
      case ABS:
        val = tree->val;
        break;
      default:
        ierror("%sIllegal tree type %d",fn,tree->type);
        break;
    }
  }
  else
    ierror("%sNULL tree",fn);

  *result = val;
  return abs;
}